

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_textedit.h
# Opt level: O2

void ImStb::stb_text_makeundo_replace
               (ImGuiInputTextState *str,STB_TexteditState *state,int where,int old_length,
               int new_length)

{
  ImWchar *pIVar1;
  ulong uVar2;
  ulong uVar3;
  
  pIVar1 = stb_text_createundo(&state->undostate,where,old_length,new_length);
  if (pIVar1 != (ImWchar *)0x0) {
    uVar2 = 0;
    uVar3 = (ulong)(uint)old_length;
    if (old_length < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      pIVar1[uVar2] = (str->TextW).Data[(long)where + uVar2];
    }
  }
  return;
}

Assistant:

static void stb_text_makeundo_replace(STB_TEXTEDIT_STRING *str, STB_TexteditState *state, int where, int old_length, int new_length)
{
   int i;
   STB_TEXTEDIT_CHARTYPE *p = stb_text_createundo(&state->undostate, where, old_length, new_length);
   if (p) {
      for (i=0; i < old_length; ++i)
         p[i] = STB_TEXTEDIT_GETCHAR(str, where+i);
   }
}